

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O1

void __thiscall
adios2::transport::FileFStream::Read(FileFStream *this,char *buffer,size_t size,size_t start)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  char cVar7;
  ulong uVar8;
  anon_class_8_1_8991fb9c lf_Read;
  string __str;
  anon_class_8_1_8991fb9c local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  char *local_b0;
  uint local_a8;
  char local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_d8.this = this;
  WaitForOpen(this);
  if (start != 0xffffffffffffffff) {
    std::istream::seekg(&this->m_FileStream,start,0);
    cVar7 = '\x01';
    if (9 < start) {
      sVar4 = start;
      cVar2 = '\x04';
      do {
        cVar7 = cVar2;
        if (sVar4 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_006483c7;
        }
        if (sVar4 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_006483c7;
        }
        if (sVar4 < 10000) goto LAB_006483c7;
        bVar1 = 99999 < sVar4;
        sVar4 = sVar4 / 10000;
        cVar2 = cVar7 + '\x04';
      } while (bVar1);
      cVar7 = cVar7 + '\x01';
    }
LAB_006483c7:
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_b0,local_a8,start);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x75ce7c);
    local_d0 = &local_c0;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_c0 = *plVar5;
      lStack_b8 = plVar3[3];
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,
                                (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar5;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_50.field_2._M_allocated_capacity = *psVar6;
      local_50.field_2._8_8_ = plVar3[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar6;
      local_50._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_50._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    CheckFile(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
  }
  if (0x7ffe7000 < size) {
    uVar8 = size / 0x7ffe7000;
    size = size % 0x7ffe7000;
    do {
      Read::anon_class_8_1_8991fb9c::operator()(&local_d8,buffer,0x7ffe7000);
      buffer = buffer + 0x7ffe7000;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  Read::anon_class_8_1_8991fb9c::operator()(&local_d8,buffer,size);
  return;
}

Assistant:

void FileFStream::Read(char *buffer, size_t size, size_t start)
{
    auto lf_Read = [&](char *buffer, size_t size) {
        ProfilerStart("read");
        m_FileStream.read(buffer, static_cast<std::streamsize>(size));
        ProfilerStop("read");
        CheckFile("couldn't read from file " + m_Name + ", in call to fstream read");
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        m_FileStream.seekg(start);
        CheckFile("couldn't move to start position " + std::to_string(start) + " in file " +
                  m_Name + ", in call to fstream seekg");
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Read(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Read(&buffer[position], remainder);
    }
    else
    {
        lf_Read(buffer, size);
    }
}